

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

tmbstr tidySystemLocale(tmbstr result)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  
  setlocale(6,"");
  __s = setlocale(6,(char *)0x0);
  sVar1 = strlen(__s);
  __dest = (char *)malloc(sVar1 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,__s);
  }
  setlocale(6,"C");
  return __dest;
}

Assistant:

tmbstr tidySystemLocale(tmbstr result)
{
    ctmbstr temp;
    
    /* This should set the OS locale. */
    setlocale( LC_ALL, "" );
    
    /* This should read the current locale. */
    temp = setlocale( LC_ALL, NULL);
    
    /* Make a new copy of the string, because temp
     always points to the current locale. */
    if (( result = malloc( strlen( temp ) + 1 ) ))
        strcpy(result, temp);
    
    /* This should restore the C locale. */
    setlocale( LC_ALL, "C" );
    
    return result;
}